

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void libxml_xmlTextReaderErrorCallback
               (void *arg,char *msg,int severity,xmlTextReaderLocatorPtr locator)

{
  PyObject *op;
  PyObject *pPVar1;
  PyObject *result;
  PyObject *list;
  xmlTextReaderPyCtxt *pyCtxt;
  xmlTextReaderLocatorPtr locator_local;
  int severity_local;
  char *msg_local;
  void *arg_local;
  
  op = (PyObject *)PyTuple_New(4);
  PyTuple_SetItem(op,0,*(undefined8 *)((long)arg + 8));
  _Py_XINCREF(*(PyObject **)((long)arg + 8));
  pPVar1 = libxml_charPtrConstWrap(msg);
  PyTuple_SetItem(op,1,pPVar1);
  pPVar1 = libxml_intWrap(severity);
  PyTuple_SetItem(op,2,pPVar1);
  pPVar1 = libxml_xmlTextReaderLocatorPtrWrap(locator);
  PyTuple_SetItem(op,3,pPVar1);
  pPVar1 = (PyObject *)PyObject_CallObject(*arg,op);
  if (pPVar1 == (PyObject *)0x0) {
    PyErr_Print();
  }
  _Py_XDECREF(op);
  _Py_XDECREF(pPVar1);
  return;
}

Assistant:

static void 
libxml_xmlTextReaderErrorCallback(void *arg, 
				  const char *msg,
				  int severity,
				  xmlTextReaderLocatorPtr locator)
{
    xmlTextReaderPyCtxt *pyCtxt = (xmlTextReaderPyCtxt *)arg;
    PyObject *list;
    PyObject *result;
    
    list = PyTuple_New(4);
    PyTuple_SetItem(list, 0, pyCtxt->arg);
    Py_XINCREF(pyCtxt->arg);
    PyTuple_SetItem(list, 1, libxml_charPtrConstWrap(msg));
    PyTuple_SetItem(list, 2, libxml_intWrap(severity));
    PyTuple_SetItem(list, 3, libxml_xmlTextReaderLocatorPtrWrap(locator));
    result = PyObject_CallObject(pyCtxt->f, list);
    if (result == NULL)
    {
	/* TODO: manage for the exception to be propagated... */
	PyErr_Print();
    }
    Py_XDECREF(list);
    Py_XDECREF(result);
}